

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O0

void Am_Move_Grow_Stop_Method_proc
               (Am_Object *inter,Am_Object *param_2,Am_Object *event_window,Am_Input_Event *ev)

{
  uint y_00;
  int x_00;
  Am_Value *pAVar1;
  undefined1 local_a0 [8];
  Am_Inter_Internal_Method inter_method;
  Am_Object local_88;
  Am_Input_Char local_7c;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Inter_Location data;
  Am_Object local_50;
  Am_Object command_obj;
  Am_Input_Char ic;
  Am_Object local_38;
  Am_Object object;
  int y;
  int x;
  Am_Input_Event *ev_local;
  Am_Object *event_window_local;
  Am_Object *param_1_local;
  Am_Object *inter_local;
  
  object.data._4_4_ = ev->x;
  object.data._0_4_ = ev->y;
  Am_Object::Am_Object(&local_38);
  pAVar1 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&local_38,pAVar1);
  command_obj.data._0_4_ = ev->input_char;
  Am_Object::Am_Object(&local_50);
  Am_Object::Get_Object((Am_Object *)&data,(Am_Slot_Key)inter,0xc5);
  Am_Object::operator=(&local_50,(Am_Object *)&data);
  Am_Object::~Am_Object((Am_Object *)&data);
  move_grow_interim_val
            (&local_60,inter,&local_50,(int)&local_38,object.data._4_4_,
             (Am_Object *)(ulong)(uint)object.data,(Am_Input_Char *)event_window);
  Am_Object::Am_Object(&local_68,inter);
  Am_Object::Am_Object(&local_70,&local_50);
  x_00 = object.data._4_4_;
  y_00 = (uint)object.data;
  Am_Object::Am_Object(&local_78,event_window);
  local_7c = command_obj.data._0_4_;
  Am_Object::Am_Object(&local_88,&local_38);
  Am_Inter_Location::Am_Inter_Location
            ((Am_Inter_Location *)&inter_method.Call,(Am_Inter_Location *)&local_60);
  Am_Call_Final_Do_And_Register
            (&local_68,&local_70,x_00,y_00,&local_78,local_7c,&local_88,
             (Am_Inter_Location *)&inter_method.Call,move_grow_set_impl_command);
  Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&inter_method.Call);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_68);
  Am_Inter_Internal_Method::Am_Inter_Internal_Method((Am_Inter_Internal_Method *)local_a0);
  pAVar1 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)local_a0,pAVar1);
  (*(code *)inter_method.from_wrapper)(inter,&local_38,event_window,ev);
  Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&local_60);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Move_Grow_Stop_Method,
                 (Am_Object & inter, Am_Object & /* object */,
                  Am_Object &event_window, Am_Input_Event *ev))
{
  int x = ev->x;
  int y = ev->y;
  // ignore object parameter, used saved object
  Am_Object object;
  object = inter.Get(Am_START_OBJECT);
  Am_INTER_TRACE_PRINT(inter, "Move_Grow stopping over " << object);
  //now, call interim_do on last point
  Am_Input_Char ic = ev->input_char;
  Am_Object command_obj;
  command_obj = inter.Get_Object(Am_COMMAND);
  Am_Inter_Location data =
      move_grow_interim_val(inter, command_obj, object, x, y, event_window, ic);

  // call DO method
  //data is points calculated by move_grow_interim_val
  Am_Call_Final_Do_And_Register(inter, command_obj, x, y, event_window, ic,
                                object, data, move_grow_set_impl_command);

  // LAST, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);
}